

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha2.c
# Opt level: O1

int SHA512_Update(SHA512_CTX *c,void *data,size_t len)

{
  ulonglong *puVar1;
  int in_EAX;
  uint uVar2;
  int iVar3;
  ulong uVar6;
  ulong extraout_RAX;
  ulong __n;
  bool bVar7;
  ulong uVar4;
  void *pvVar5;
  
  if (len == 0) {
    return in_EAX;
  }
  if ((c == (SHA512_CTX *)0x0) || (data == (void *)0x0)) {
    __assert_fail("context != (SHA512_CTX*)0 && data != (sha2_byte*)0",
                  "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sha2.c",
                  0x349,"void SHA512_Update(SHA512_CTX *, const sha2_byte *, size_t)");
  }
  uVar2 = (uint)c->Nl >> 3 & 0x7f;
  uVar4 = (ulong)uVar2;
  if (uVar2 != 0) {
    __n = (ulong)(0x80 - uVar2);
    pvVar5 = (void *)((long)c->h + (ulong)uVar2 + 0x50);
    if (len < __n) {
      pvVar5 = memcpy(pvVar5,data,len);
      iVar3 = (int)pvVar5;
      puVar1 = &c->Nl;
      bVar7 = CARRY8(*puVar1,len * 8);
      *puVar1 = *puVar1 + len * 8;
      goto joined_r0x00116b3f;
    }
    memcpy(pvVar5,data,__n);
    uVar6 = (ulong)((0x80 - uVar2) * 8);
    puVar1 = &c->Nl;
    uVar4 = *puVar1;
    *puVar1 = *puVar1 + uVar6;
    if (CARRY8(uVar4,uVar6)) {
      c->Nh = c->Nh + 1;
    }
    data = (void *)((long)data + __n);
    SHA512_Transform(c,(c->u).p);
    uVar4 = extraout_RAX;
    len = len - __n;
  }
  for (; 0x7f < len; len = len - 0x80) {
    SHA512_Transform(c,(uchar *)data);
    uVar4 = c->Nl;
    c->Nl = uVar4 + 0x400;
    if (0xfffffffffffffbff < uVar4) {
      c->Nh = c->Nh + 1;
    }
    data = (void *)((long)data + 0x80);
  }
  if (len == 0) {
    return (int)uVar4;
  }
  pvVar5 = memcpy(&c->u,data,len);
  iVar3 = (int)pvVar5;
  puVar1 = &c->Nl;
  bVar7 = CARRY8(*puVar1,len * 8);
  *puVar1 = *puVar1 + len * 8;
joined_r0x00116b3f:
  if (bVar7) {
    c->Nh = c->Nh + 1;
  }
  return iVar3;
}

Assistant:

void SHA512_Update(SHA512_CTX* context, const sha2_byte *data, size_t len) {
	unsigned int	freespace, usedspace;

	if (len == 0) {
		/* Calling with no data is valid - we do nothing */
		return;
	}

	/* Sanity check: */
	assert(context != (SHA512_CTX*)0 && data != (sha2_byte*)0);

	usedspace = (context->bitcount[0] >> 3) % SHA512_BLOCK_LENGTH;
	if (usedspace > 0) {
		/* Calculate how much free space is available in the buffer */
		freespace = SHA512_BLOCK_LENGTH - usedspace;

		if (len >= freespace) {
			/* Fill the buffer completely and process it */
			MEMCPY_BCOPY(&context->buffer[usedspace], data, freespace);
			ADDINC128(context->bitcount, freespace << 3);
			len -= freespace;
			data += freespace;
			SHA512_Transform(context, (sha2_word64*)context->buffer);
		} else {
			/* The buffer is not yet full */
			MEMCPY_BCOPY(&context->buffer[usedspace], data, len);
			ADDINC128(context->bitcount, len << 3);
			return;
		}
	}
	while (len >= SHA512_BLOCK_LENGTH) {
		/* Process as many complete blocks as we can */
		SHA512_Transform(context, (sha2_word64*)data);
		ADDINC128(context->bitcount, SHA512_BLOCK_LENGTH << 3);
		len -= SHA512_BLOCK_LENGTH;
		data += SHA512_BLOCK_LENGTH;
	}
	if (len > 0) {
		/* There's left-overs, so save 'em */
		MEMCPY_BCOPY(context->buffer, data, len);
		ADDINC128(context->bitcount, len << 3);
	}
}